

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O2

void __thiscall llvm::FoldingSetNodeID::AddPointer(FoldingSetNodeID *this,void *Ptr)

{
  AddInteger(this,(uint)Ptr);
  AddInteger(this,(uint)((ulong)Ptr >> 0x20));
  return;
}

Assistant:

void FoldingSetNodeID::AddInteger(unsigned long I) {
  if (sizeof(long) == sizeof(int))
    AddInteger(unsigned(I));
  else if (sizeof(long) == sizeof(long long)) {
    AddInteger((unsigned long long)I);
  } else {
    llvm_unreachable("unexpected sizeof(long)");
  }
}